

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_expr.hpp
# Opt level: O0

bool __thiscall
viennamath::rt_binary_expr<viennamath::rt_expression_interface<double>_>::can_simplify
          (rt_binary_expr<viennamath::rt_expression_interface<double>_> *this)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  rt_binary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->lhs_);
  uVar1 = (*peVar3->_vptr_rt_expression_interface[8])();
  if ((uVar1 & 1) != 0) {
    peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->rhs_);
    uVar1 = (*peVar3->_vptr_rt_expression_interface[8])();
    if ((uVar1 & 1) != 0) {
      return true;
    }
  }
  peVar4 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>::
           operator->(&this->op_);
  peVar3 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::get(&this->lhs_);
  peVar5 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::get(&this->rhs_);
  iVar2 = (*peVar4->_vptr_op_interface[0xb])(peVar4,peVar3,peVar5);
  return (bool)((byte)iVar2 & 1);
}

Assistant:

bool can_simplify() const
      {
        if (lhs_->is_constant() && rhs_->is_constant())
        {
          //std::cout << "optimizable(): true in rt_binary_expr" << std::endl;
          return true;
        }
        return op_->can_simplify(lhs_.get(), rhs_.get());
      }